

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_info.cpp
# Opt level: O1

void __thiscall duckdb::ChunkVectorInfo::Write(ChunkVectorInfo *this,WriteStream *writer)

{
  byte bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  idx_t iVar4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  idx_t iVar6;
  idx_t iVar7;
  SelectionVector sel;
  ValidityMask local_88;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  unsigned_long local_50;
  SelectionVector local_48;
  
  SelectionVector::SelectionVector(&local_48,0x800);
  iVar4 = TemplatedGetSelVector<duckdb::TransactionVersionOperator>
                    (this,0x400000000000005f,0xffffffffffffffff,&local_48,0x800);
  if (iVar4 == 0) {
    local_88.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)
         ((ulong)local_88.super_TemplatedValidityMask<unsigned_long>.validity_mask._1_7_ << 8);
    (**writer->_vptr_WriteStream)(writer,&local_88,1);
    local_88.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)(this->super_ChunkInfo).start;
    (**writer->_vptr_WriteStream)(writer,&local_88,8);
  }
  else if (iVar4 == 0x800) {
    local_88.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)
         CONCAT71(local_88.super_TemplatedValidityMask<unsigned_long>.validity_mask._1_7_,2);
    (**writer->_vptr_WriteStream)(writer,&local_88,1);
  }
  else {
    local_88.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)
         CONCAT71(local_88.super_TemplatedValidityMask<unsigned_long>.validity_mask._1_7_,
                  (this->super_ChunkInfo).type);
    (**writer->_vptr_WriteStream)(writer,&local_88,1);
    local_88.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)(this->super_ChunkInfo).start;
    (**writer->_vptr_WriteStream)(writer,&local_88,8);
    local_88.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0;
    local_88.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_88.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88.super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
    local_50 = 0x800;
    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
              ((duckdb *)&local_68,&local_50);
    p_Var3 = p_Stack_60;
    local_88.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_68;
    _Var2._M_pi = local_88.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    local_68 = (element_type *)0x0;
    p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var3;
    if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
    }
    if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
    }
    pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                       (&local_88.super_TemplatedValidityMask<unsigned_long>.validity_data);
    local_88.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (pTVar5->owned_data).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    if (iVar4 != 0) {
      iVar6 = 0;
      do {
        iVar7 = iVar6;
        if (local_48.sel_vector != (sel_t *)0x0) {
          iVar7 = (idx_t)local_48.sel_vector[iVar6];
        }
        if (local_88.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_50 = local_88.super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_68,&local_50);
          p_Var3 = p_Stack_60;
          local_88.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = local_68;
          _Var2._M_pi = local_88.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          local_68 = (element_type *)0x0;
          p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_88.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var3;
          if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
          }
          if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
          }
          pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (&local_88.super_TemplatedValidityMask<unsigned_long>.validity_data);
          local_88.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (pTVar5->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        bVar1 = (byte)iVar7 & 0x3f;
        local_88.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar7 >> 6] =
             local_88.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar7 >> 6] &
             (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
        iVar6 = iVar6 + 1;
      } while (iVar4 != iVar6);
    }
    ValidityMask::Write(&local_88,writer,0x800);
    if (local_88.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  if (local_48.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void ChunkVectorInfo::Write(WriteStream &writer) const {
	SelectionVector sel(STANDARD_VECTOR_SIZE);
	transaction_t start_time = TRANSACTION_ID_START - 1;
	transaction_t transaction_id = DConstants::INVALID_INDEX;
	idx_t count = GetSelVector(start_time, transaction_id, sel, STANDARD_VECTOR_SIZE);
	if (count == STANDARD_VECTOR_SIZE) {
		// nothing is deleted: skip writing anything
		writer.Write<ChunkInfoType>(ChunkInfoType::EMPTY_INFO);
		return;
	}
	if (count == 0) {
		// everything is deleted: write a constant vector
		writer.Write<ChunkInfoType>(ChunkInfoType::CONSTANT_INFO);
		writer.Write<idx_t>(start);
		return;
	}
	// write a boolean vector
	ChunkInfo::Write(writer);
	writer.Write<idx_t>(start);
	ValidityMask mask(STANDARD_VECTOR_SIZE);
	mask.Initialize(STANDARD_VECTOR_SIZE);
	for (idx_t i = 0; i < count; i++) {
		mask.SetInvalid(sel.get_index(i));
	}
	mask.Write(writer, STANDARD_VECTOR_SIZE);
}